

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_call_c_function(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                          int flags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  JSRuntime *pJVar6;
  JSContext *ctx_00;
  code *pcVar7;
  int64_t iVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  JSValueUnion JVar12;
  ulong uVar13;
  long lVar14;
  JSValue *pJVar15;
  JSValueUnion JVar16;
  int64_t *piVar17;
  int64_t iVar18;
  bool bVar19;
  anon_union_8_2_94730072 u;
  double dVar20;
  JSValue JVar21;
  JSValue JVar22;
  undefined1 auStack_98 [16];
  JSStackFrame sf_s;
  double d2;
  int done;
  
  iVar18 = this_obj.tag;
  JVar12 = this_obj.u;
  JVar16 = func_obj.u;
  pJVar15 = (JSValue *)auStack_98;
  pJVar6 = ctx->rt;
  bVar3 = *(byte *)((long)JVar16.ptr + 0x40);
  if (&stack0xfffffffffffffff8 + (ulong)bVar3 * -0x10 < (undefined1 *)pJVar6->stack_limit) {
    JS_ThrowStackOverflow(ctx);
    iVar18 = 6;
    JVar12.float64 = 0.0;
    goto LAB_00114126;
  }
  bVar4 = *(byte *)((long)JVar16.ptr + 0x41);
  auStack_98._8_8_ = pJVar6->current_stack_frame;
  pJVar6->current_stack_frame = (JSStackFrame *)(auStack_98 + 8);
  ctx_00 = *(JSContext **)((long)JVar16.ptr + 0x30);
  sf_s.cur_pc._4_4_ = 0;
  sf_s.prev_frame = (JSStackFrame *)JVar16.ptr;
  sf_s.cur_func.u = (JSValueUnion)func_obj.tag;
  sf_s.cur_pc._0_4_ = argc;
  if (argc < (int)(uint)bVar3) {
    pJVar15 = (JSValue *)(auStack_98 + -(ulong)((uint)bVar3 * 0x10));
    lVar14 = 0;
    uVar13 = 0;
    if (0 < argc) {
      uVar13 = (ulong)(uint)argc;
    }
    for (; uVar13 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
      puVar1 = (undefined8 *)((long)&argv->u + lVar14);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pJVar15->u + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
    }
    lVar14 = (ulong)bVar3 - (long)argc;
    piVar17 = &pJVar15[argc].tag;
    while( true ) {
      bVar19 = lVar14 == 0;
      lVar14 = lVar14 + -1;
      if (bVar19) break;
      (((JSValue *)(piVar17 + -1))->u).int32 = 0;
      *piVar17 = 3;
      piVar17 = piVar17 + 2;
    }
    sf_s.cur_pc._0_4_ = (uint)bVar3;
    argv = pJVar15;
  }
  sf_s.cur_func.tag = (int64_t)argv;
  if (0xc < bVar4) {
    pJVar15[-1].tag = (int64_t)js_c_function_data_call;
    abort();
  }
  uVar13 = (ulong)JVar12.ptr & 0xffffffff00000000;
  pcVar7 = *(code **)((long)JVar16.ptr + 0x38);
  switch(bVar4) {
  case 0:
    goto switchD_00113f02_caseD_0;
  case 1:
    goto switchD_00113f02_caseD_1;
  default:
    if ((flags & 1U) == 0) {
      if (bVar4 == 2) {
LAB_00113f42:
        pJVar15[-1].tag = 0x113f56;
        JS_ThrowTypeError(ctx_00,"must be called with new");
        pJVar15[-1].tag = 6;
        uVar13 = pJVar15[-1].tag;
        goto LAB_00113f5a;
      }
      pJVar15[-1].tag = 3;
      iVar18 = pJVar15[-1].tag;
      JVar12.float64 = 0.0;
    }
    goto switchD_00113f02_caseD_0;
  case 3:
  case 5:
    if ((flags & 1U) == 0) {
      if (bVar4 == 3) goto LAB_00113f42;
      pJVar15[-1].tag = 3;
      iVar18 = pJVar15[-1].tag;
      JVar12.float64 = 0.0;
    }
    goto switchD_00113f02_caseD_1;
  case 6:
    JVar21 = *argv;
    pJVar15[-1].tag = 0x114069;
    iVar11 = JS_ToFloat64(ctx_00,&d2,JVar21);
    if (iVar11 != 0) {
      pJVar15[-1].tag = 6;
      uVar13 = pJVar15[-1].tag;
      goto LAB_00113f5a;
    }
    pJVar15[-1].tag = 0x114079;
    dVar20 = (double)(*pcVar7)(CONCAT44(d2._4_4_,d2._0_4_));
LAB_00114079:
    uVar13 = (ulong)dVar20 & 0xffffffff;
    JVar12.float64 = dVar20 & 0xffffffff00000000;
    if (dVar20 == (double)(int)dVar20) {
      uVar13 = (ulong)(uint)(int)dVar20;
      JVar12.float64 = 0.0;
    }
    pJVar15[-1].tag = 7;
    JVar16 = (JSValueUnion)pJVar15[-1].tag;
    if (dVar20 == (double)(int)dVar20) {
      JVar16.float64 = 0.0;
    }
    JVar21.tag = (int64_t)JVar16.ptr;
    JVar21.u.float64 = uVar13 | JVar12.float64;
    goto LAB_0011410f;
  case 7:
    JVar21 = *argv;
    pJVar15[-1].tag = 0x11401f;
    iVar11 = JS_ToFloat64(ctx_00,&d2,JVar21);
    pJVar15[-1].tag = 6;
    uVar13 = pJVar15[-1].tag;
    if (iVar11 == 0) {
      JVar21 = argv[1];
      pJVar15[-1].tag = 0x11403f;
      iVar11 = JS_ToFloat64(ctx_00,(double *)&sf_s.cur_sp,JVar21);
      if (iVar11 == 0) {
        pJVar15[-1].tag = 0x114054;
        dVar20 = (double)(*pcVar7)(CONCAT44(d2._4_4_,d2._0_4_),sf_s.cur_sp._0_4_);
        goto LAB_00114079;
      }
    }
LAB_00113f5a:
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar13;
    JVar21 = (JSValue)(auVar10 << 0x40);
    break;
  case 8:
    pJVar15[-1].tag = 0x1140d9;
    JVar21 = (JSValue)(*pcVar7)(ctx_00,JVar12.float64,iVar18);
    break;
  case 9:
    dVar20 = (argv->u).float64;
    iVar8 = argv->tag;
    pJVar15[-1].tag = 0x114007;
    JVar21 = (JSValue)(*pcVar7)(ctx_00,JVar12.float64,iVar18,dVar20,iVar8);
    break;
  case 10:
    sVar5 = *(short *)((long)JVar16.ptr + 0x42);
    pJVar15[-1].tag = 0x1140cb;
    JVar21 = (JSValue)(*pcVar7)(ctx_00,JVar12.float64,iVar18,(int)sVar5);
    break;
  case 0xb:
    sVar5 = *(short *)((long)JVar16.ptr + 0x42);
    dVar20 = (argv->u).float64;
    iVar8 = argv->tag;
    pJVar15[-1].tag = 0x113f7f;
    JVar21 = (JSValue)(*pcVar7)(ctx_00,JVar12.float64,iVar18,dVar20,iVar8,(int)sVar5);
    break;
  case 0xc:
    JVar16._0_4_ = (uint)*(short *)((long)JVar16.ptr + 0x42);
    JVar16._4_4_ = 0;
    pJVar15[-1].u = JVar16;
    pJVar15[-2].tag = 0x113fa6;
    JVar21 = (JSValue)(*pcVar7)(ctx_00,JVar12.float64,iVar18,argc,argv,&d2);
    if (d2._0_4_ != 2 && (int)JVar21.tag != 6) {
      pJVar15[-1].tag = 0x113fd6;
      JVar21 = js_create_iterator_result(ctx_00,JVar21,d2._0_4_);
    }
    JVar12 = JVar21.u;
    goto LAB_0011410f;
  }
LAB_00114105:
  JVar12 = JVar21.u;
LAB_0011410f:
  iVar18 = JVar21.tag;
  pJVar6->current_stack_frame = (JSStackFrame *)auStack_98._8_8_;
  JVar12.ptr = (void *)((ulong)JVar21.u.ptr & 0xffffffff | (ulong)JVar12.ptr & 0xffffffff00000000);
LAB_00114126:
  JVar22.tag = iVar18;
  JVar22.u.float64 = JVar12.float64;
  return JVar22;
switchD_00113f02_caseD_1:
  sVar5 = *(short *)((long)JVar16.ptr + 0x42);
  pJVar15[-1].tag = 0x1140fc;
  JVar21 = (JSValue)(*pcVar7)(ctx_00,(ulong)JVar12.ptr & 0xffffffff | uVar13,iVar18,argc,argv,
                              (int)sVar5);
  goto LAB_00114105;
switchD_00113f02_caseD_0:
  pJVar15[-1].tag = 0x113f2a;
  JVar21 = (JSValue)(*pcVar7)(ctx_00,(ulong)JVar12.ptr & 0xffffffff | uVar13,iVar18,argc,argv);
  goto LAB_00114105;
}

Assistant:

static JSValue js_call_c_function(JSContext *ctx, JSValueConst func_obj,
                                  JSValueConst this_obj,
                                  int argc, JSValueConst *argv, int flags)
{
    JSRuntime *rt = ctx->rt;
    JSCFunctionType func;
    JSObject *p;
    JSStackFrame sf_s, *sf = &sf_s, *prev_sf;
    JSValue ret_val;
    JSValueConst *arg_buf;
    int arg_count, i;
    JSCFunctionEnum cproto;

    p = JS_VALUE_GET_OBJ(func_obj);
    cproto = p->u.cfunc.cproto;
    arg_count = p->u.cfunc.length;

    /* better to always check stack overflow */
    if (js_check_stack_overflow(rt, sizeof(arg_buf[0]) * arg_count))
        return JS_ThrowStackOverflow(ctx);

    prev_sf = rt->current_stack_frame;
    sf->prev_frame = prev_sf;
    rt->current_stack_frame = sf;
    ctx = p->u.cfunc.realm; /* change the current realm */
    
#ifdef CONFIG_BIGNUM
    /* we only propagate the bignum mode as some runtime functions
       test it */
    if (prev_sf)
        sf->js_mode = prev_sf->js_mode & JS_MODE_MATH;
    else
        sf->js_mode = 0;
#else
    sf->js_mode = 0;
#endif
    sf->cur_func = (JSValue)func_obj;
    sf->arg_count = argc;
    arg_buf = argv;

    if (unlikely(argc < arg_count)) {
        /* ensure that at least argc_count arguments are readable */
        arg_buf = alloca(sizeof(arg_buf[0]) * arg_count);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < arg_count; i++)
            arg_buf[i] = JS_UNDEFINED;
        sf->arg_count = arg_count;
    }
    sf->arg_buf = (JSValue*)arg_buf;

    func = p->u.cfunc.c_function;
    switch(cproto) {
    case JS_CFUNC_constructor:
    case JS_CFUNC_constructor_or_func:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor) {
            not_a_constructor:
                ret_val = JS_ThrowTypeError(ctx, "must be called with new");
                break;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* here this_obj is new_target */
        /* fall thru */
    case JS_CFUNC_generic:
        ret_val = func.generic(ctx, this_obj, argc, arg_buf);
        break;
    case JS_CFUNC_constructor_magic:
    case JS_CFUNC_constructor_or_func_magic:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor_magic) {
                goto not_a_constructor;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* fall thru */
    case JS_CFUNC_generic_magic:
        ret_val = func.generic_magic(ctx, this_obj, argc, arg_buf,
                                     p->u.cfunc.magic);
        break;
    case JS_CFUNC_getter:
        ret_val = func.getter(ctx, this_obj);
        break;
    case JS_CFUNC_setter:
        ret_val = func.setter(ctx, this_obj, arg_buf[0]);
        break;
    case JS_CFUNC_getter_magic:
        ret_val = func.getter_magic(ctx, this_obj, p->u.cfunc.magic);
        break;
    case JS_CFUNC_setter_magic:
        ret_val = func.setter_magic(ctx, this_obj, arg_buf[0], p->u.cfunc.magic);
        break;
    case JS_CFUNC_f_f:
        {
            double d1;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f(d1));
        }
        break;
    case JS_CFUNC_f_f_f:
        {
            double d1, d2;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            if (unlikely(JS_ToFloat64(ctx, &d2, arg_buf[1]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f_f(d1, d2));
        }
        break;
    case JS_CFUNC_iterator_next:
        {
            int done;
            ret_val = func.iterator_next(ctx, this_obj, argc, arg_buf,
                                         &done, p->u.cfunc.magic);
            if (!JS_IsException(ret_val) && done != 2) {
                ret_val = js_create_iterator_result(ctx, ret_val, done);
            }
        }
        break;
    default:
        abort();
    }

    rt->current_stack_frame = sf->prev_frame;
    return ret_val;
}